

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O0

void __thiscall kratos::DependencyVisitor::visit(DependencyVisitor *this,Generator *generator)

{
  StatementType SVar1;
  StatementBlockType SVar2;
  element_type *peVar3;
  element_type *assign_00;
  element_type *peVar4;
  element_type *block_00;
  element_type *block_01;
  element_type *stmt_00;
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  undefined1 local_70 [8];
  shared_ptr<kratos::StmtBlock> block;
  shared_ptr<kratos::AssignStmt> assign;
  undefined1 local_40 [24];
  shared_ptr<kratos::Stmt> *stmt;
  uint64_t i;
  uint64_t stmt_count;
  Generator *generator_local;
  DependencyVisitor *this_local;
  
  stmt_count = (uint64_t)generator;
  generator_local = (Generator *)this;
  i = Generator::stmts_count(generator);
  for (stmt = (shared_ptr<kratos::Stmt> *)0x0; stmt < i;
      stmt = (shared_ptr<kratos::Stmt> *)
             ((long)&(stmt->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + 1
             )) {
    Generator::get_stmt((Generator *)local_40,(uint32_t)stmt_count);
    local_40._16_8_ = (Generator *)local_40;
    peVar3 = std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_40);
    SVar1 = Stmt::type(peVar3);
    if (SVar1 == Assign) {
      std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 local_40._16_8_);
      Stmt::as<kratos::AssignStmt>
                ((Stmt *)&block.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
      assign_00 = std::__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>::get
                            ((__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2> *)
                             &block.
                              super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
      visit_assign(this,assign_00);
      std::shared_ptr<kratos::AssignStmt>::~shared_ptr
                ((shared_ptr<kratos::AssignStmt> *)
                 &block.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    else {
      peVar3 = std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_40._16_8_);
      SVar1 = Stmt::type(peVar3);
      if (SVar1 == Block) {
        std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   local_40._16_8_);
        Stmt::as<kratos::StmtBlock>((Stmt *)local_70);
        peVar4 = std::
                 __shared_ptr_access<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_70);
        SVar2 = StmtBlock::block_type(peVar4);
        if (SVar2 == Sequential) {
          std::__shared_ptr_access<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)local_70);
          Stmt::as<kratos::SequentialStmtBlock>((Stmt *)local_80);
          block_00 = std::__shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>::get
                               ((__shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                                 *)local_80);
          visit_block(this,block_00);
          std::shared_ptr<kratos::SequentialStmtBlock>::~shared_ptr
                    ((shared_ptr<kratos::SequentialStmtBlock> *)local_80);
        }
        else {
          peVar4 = std::
                   __shared_ptr_access<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_70);
          SVar2 = StmtBlock::block_type(peVar4);
          if (SVar2 == Combinational) {
            std::__shared_ptr_access<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_70);
            Stmt::as<kratos::CombinationalStmtBlock>((Stmt *)local_90);
            block_01 = std::__shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                       ::get((__shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                              *)local_90);
            visit_block(this,block_01);
            std::shared_ptr<kratos::CombinationalStmtBlock>::~shared_ptr
                      ((shared_ptr<kratos::CombinationalStmtBlock> *)local_90);
          }
        }
        std::shared_ptr<kratos::StmtBlock>::~shared_ptr((shared_ptr<kratos::StmtBlock> *)local_70);
      }
      else {
        peVar3 = std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_40._16_8_);
        SVar1 = Stmt::type(peVar3);
        if (SVar1 == ModuleInstantiation) {
          std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     local_40._16_8_);
          Stmt::as<kratos::ModuleInstantiationStmt>((Stmt *)local_a0);
          stmt_00 = std::__shared_ptr<kratos::ModuleInstantiationStmt,_(__gnu_cxx::_Lock_policy)2>::
                    get((__shared_ptr<kratos::ModuleInstantiationStmt,_(__gnu_cxx::_Lock_policy)2> *
                        )local_a0);
          visit_module_instantiation(this,stmt_00);
          std::shared_ptr<kratos::ModuleInstantiationStmt>::~shared_ptr
                    ((shared_ptr<kratos::ModuleInstantiationStmt> *)local_a0);
        }
      }
    }
    std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)local_40);
  }
  return;
}

Assistant:

void visit(Generator *generator) override {
        // visit the top and find out top level assignments
        uint64_t stmt_count = generator->stmts_count();
        for (uint64_t i = 0; i < stmt_count; i++) {
            auto const &stmt = generator->get_stmt(i);
            if (stmt->type() == StatementType::Assign) {
                auto assign = stmt->as<AssignStmt>();
                visit_assign(assign.get());
            } else if (stmt->type() == StatementType::Block) {
                auto block = stmt->as<StmtBlock>();
                if (block->block_type() == StatementBlockType::Sequential) {
                    visit_block(block->as<SequentialStmtBlock>().get());
                } else if (block->block_type() == StatementBlockType::Combinational) {
                    visit_block(block->as<CombinationalStmtBlock>().get());
                }
            } else if (stmt->type() == StatementType::ModuleInstantiation) {
                visit_module_instantiation(stmt->as<ModuleInstantiationStmt>().get());
            }
        }
    }